

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O2

void __thiscall
Js::ByteCodeWriter::Property
          (ByteCodeWriter *this,OpCode op,RegSlot value,RegSlot instance,
          PropertyIdIndexType propertyIdIndex,bool forceStrictMode)

{
  code *pcVar1;
  bool bVar2;
  OpCode op_00;
  RegSlot value_00;
  RegSlot instance_00;
  undefined4 *puVar3;
  
  CheckOpen(this);
  CheckOp(this,op,(OpLayoutType)0x32);
  bVar2 = OpCodeAttr::HasMultiSizeLayout(op);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x5e9,"(OpCodeAttr::HasMultiSizeLayout(op))",
                                "OpCodeAttr::HasMultiSizeLayout(op)");
    if (!bVar2) goto LAB_007cd791;
    *puVar3 = 0;
  }
  value_00 = ConsumeReg(this,value);
  instance_00 = ConsumeReg(this,instance);
  if ((((0x3f < op - 0x118) || ((0x8c00000000400003U >> ((ulong)(op - 0x118) & 0x3f) & 1) == 0)) &&
      (1 < op - 0x80)) && ((op != LdElemUndefScoped && (op != StFuncExpr)))) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x5fe,"(false)",
                                "The specified OpCode is not intended for field-access");
    if (!bVar2) goto LAB_007cd791;
    *puVar3 = 0;
  }
  op_00 = op;
  if (((((this->m_functionWrite->super_ParseableFunctionInfo).super_FunctionProxy.field_0x46 & 1) !=
        0 || forceStrictMode) && (op_00 = DeleteFldStrict, op != DeleteFld)) &&
     (op_00 = DeleteRootFldStrict, op != DeleteRootFld)) {
    op_00 = op;
  }
  bVar2 = TryWriteElementC<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                    (this,op_00,value_00,instance_00,propertyIdIndex);
  if (((!bVar2) &&
      (bVar2 = TryWriteElementC<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                         (this,op_00,value_00,instance_00,propertyIdIndex), !bVar2)) &&
     (bVar2 = TryWriteElementC<Js::LayoutSizePolicy<(Js::LayoutSize)2>>
                        (this,op_00,value_00,instance_00,propertyIdIndex), !bVar2)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x610,"(success)","success");
    if (!bVar2) {
LAB_007cd791:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  return;
}

Assistant:

void ByteCodeWriter::Property(OpCode op, RegSlot value, RegSlot instance, PropertyIdIndexType propertyIdIndex, bool forceStrictMode)
    {
        CheckOpen();
        CheckOp(op, OpLayoutType::ElementC);
        Assert(OpCodeAttr::HasMultiSizeLayout(op));

        value = ConsumeReg(value);
        instance = ConsumeReg(instance);

#if DBG
        switch (op)
        {
        case OpCode::InitSetFld:
        case OpCode::InitGetFld:
        case OpCode::InitClassMemberGet:
        case OpCode::InitClassMemberSet:
        case OpCode::InitProto:
        case OpCode::DeleteFld:
        case OpCode::DeleteFld_ReuseLoc:
        case OpCode::DeleteRootFld:
        case OpCode::LdElemUndefScoped:
        case OpCode::StFuncExpr:
            break;

        default:
            AssertMsg(false, "The specified OpCode is not intended for field-access");
            break;
        }
#endif

        if (this->m_functionWrite->GetIsStrictMode() || forceStrictMode)
        {
            if (op == OpCode::DeleteFld)
            {
                op = OpCode::DeleteFldStrict;
            }
            else if (op == OpCode::DeleteRootFld)
            {
                // We will reach here when in the language service mode, since in that mode we have skipped that error.
                op = OpCode::DeleteRootFldStrict;
            }
        }

        MULTISIZE_LAYOUT_WRITE(ElementC, op, value, instance, propertyIdIndex);
    }